

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O3

void __thiscall PingServer::incomingData(PingServer *this,Stream *stream)

{
  long *plVar1;
  ostream *poVar2;
  char c;
  IPV4Address source;
  char local_51;
  IPV4Address local_50 [8];
  char local_48;
  undefined7 uStack_47;
  long local_40;
  long local_38 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"new data....",0xc);
  if (stream != (Stream *)0x0) {
    plVar1 = (long *)__dynamic_cast(stream,&Dashel::Stream::typeinfo,&Dashel::PacketStream::typeinfo
                                    ,0xffffffffffffffff);
    if (plVar1 != (long *)0x0) {
      Dashel::IPV4Address::IPV4Address(local_50,0,0);
      (**(code **)(*plVar1 + 8))(plVar1,local_50);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Ping from ",10);
      Dashel::IPV4Address::hostname_abi_cxx11_();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)CONCAT71(uStack_47,local_48),local_40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      if ((long *)CONCAT71(uStack_47,local_48) != local_38) {
        operator_delete((long *)CONCAT71(uStack_47,local_48),local_38[0] + 1);
      }
      (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0x18)) + 0x20))
                ((long)plVar1 + *(long *)(*plVar1 + -0x18),&local_51,1);
      if (local_51 != '\0') {
        do {
          local_48 = local_51;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_48,1);
          (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0x18)) + 0x20))
                    ((long)plVar1 + *(long *)(*plVar1 + -0x18),&local_51,1);
        } while (local_51 != '\0');
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
      return;
    }
  }
  __assert_fail("packetStream",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/udp.cpp"
                ,0x1d,"virtual void PingServer::incomingData(Stream *)");
}

Assistant:

void incomingData(Stream* stream)
	{
		cerr << "new data....";
		PacketStream* packetStream = dynamic_cast<PacketStream*>(stream);
		assert(packetStream);
		IPV4Address source;

		packetStream->receive(source);
		cerr << "Ping from " << source.hostname() << ":" << source.port << ": ";

		char c;
		while (true)
		{
			packetStream->read(&c, 1);
			if (c)
				cerr << c;
			else
				break;
		}
		cerr << endl;
	}